

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::prepend_move(xml_node *this,xml_node *moved)

{
  bool bVar1;
  xml_node *pxVar2;
  xml_node local_18;
  
  pxVar2 = &local_18;
  bVar1 = impl::anon_unknown_0::allow_move(this,moved);
  if (bVar1) {
    impl::anon_unknown_0::remove_node(moved->_root);
    impl::anon_unknown_0::prepend_node(moved->_root,this->_root);
    pxVar2 = moved;
  }
  else {
    xml_node(&local_18);
  }
  return (xml_node)pxVar2->_root;
}

Assistant:

PUGI__FN xml_node xml_node::prepend_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::remove_node(moved._root);
		impl::prepend_node(moved._root, _root);

		return moved;
	}